

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::SonarQubeReporter(SonarQubeReporter *this,ReporterConfig *config)

{
  ReporterConfig *config_local;
  SonarQubeReporter *this_local;
  
  CumulativeReporterBase::CumulativeReporterBase(&this->super_CumulativeReporterBase,config);
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener
       = (_func_int **)&PTR__SonarQubeReporter_005018e0;
  XmlWriter::XmlWriter(&this->xml,(this->super_CumulativeReporterBase).super_ReporterBase.m_stream);
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldRedirectStdOut = true;
  (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldReportAllAssertions = true;
  (this->super_CumulativeReporterBase).m_shouldStoreSuccesfulAssertions = false;
  return;
}

Assistant:

SonarQubeReporter(ReporterConfig&& config)
        : CumulativeReporterBase(CATCH_MOVE(config))
        , xml(m_stream) {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
            m_shouldStoreSuccesfulAssertions = false;
        }